

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::CommissionerApp::SetRegistrarHostname
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aHostname)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  ErrorCode EVar3;
  element_type *peVar4;
  char *from;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *to;
  string_view fmt;
  format_args args;
  writer write;
  BbrDataset bbrDataset;
  BbrDataset bbrDatasetWithRegAddr;
  undefined1 local_198 [8];
  char *pcStack_190;
  size_t local_188;
  char local_180 [8];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_178;
  code *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  string *local_158;
  writer local_150;
  string local_148;
  undefined1 local_128 [32];
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  ushort local_c8;
  BbrDataset local_c0;
  ErrorCode local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_160 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_160;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_128._0_8_ = local_128 + 0x10;
  local_128._8_8_ = 0;
  local_128[0x10] = '\0';
  local_108._M_p = (pointer)&local_f8;
  local_100 = 0;
  local_f8._M_local_buf[0] = '\0';
  local_e8._M_p = (pointer)&local_d8;
  local_e0 = 0;
  local_d8._M_local_buf[0] = '\0';
  local_c8 = 0;
  local_c0.mTriHostname._M_dataplus._M_p = (pointer)&local_c0.mTriHostname.field_2;
  local_c0.mTriHostname._M_string_length = 0;
  local_c0.mTriHostname.field_2._M_local_buf[0] = '\0';
  local_c0.mRegistrarHostname._M_dataplus._M_p = (pointer)&local_c0.mRegistrarHostname.field_2;
  local_c0.mRegistrarHostname._M_string_length = 0;
  local_c0.mRegistrarHostname.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_c0.mRegistrarIpv6Addr.field_2;
  local_c0.mRegistrarIpv6Addr._M_string_length = 0;
  local_c0.mRegistrarIpv6Addr.field_2._M_local_buf[0] = '\0';
  local_c0.mPresentFlags = 0;
  local_158 = aHostname;
  local_c0.mRegistrarIpv6Addr._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_assign((string *)&local_108);
  local_c8 = local_c8 | 0x4000;
  (*((this->mCommissioner).
     super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Commissioner[0x16])(local_198);
  __return_storage_ptr__->mCode = local_198._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&pcStack_190);
  EVar3 = __return_storage_ptr__->mCode;
  if (pcStack_190 != local_180) {
    operator_delete(pcStack_190);
  }
  if (EVar3 == kNone) {
    peVar4 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar4->_vptr_Commissioner[0x18])(local_198,peVar4,&local_c0,0x2000);
    __return_storage_ptr__->mCode = local_198._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&pcStack_190);
    EVar3 = __return_storage_ptr__->mCode;
    if (pcStack_190 != local_180) {
      operator_delete(pcStack_190);
    }
    if (EVar3 == kNone) {
      if ((local_c0.mPresentFlags & 0x2000) == 0) {
        local_198._0_4_ = string_type;
        from = "cannot resolve the Registrar Hostname: {}";
        pcStack_190 = "cannot resolve the Registrar Hostname: {}";
        local_188 = 0x29;
        local_180 = (char  [8])0x100000000;
        local_178 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_198;
        local_170 = ::fmt::v10::detail::
                    parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        local_150.handler_ = local_178;
        do {
          cVar2 = *from;
          to = from;
          while (cVar2 != '{') {
            to = to + 1;
            if (to == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()(&local_150,from,"");
              goto LAB_001b00cf;
            }
            cVar2 = *to;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&local_150,from,to);
          from = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (to,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_198);
        } while (from != "");
LAB_001b00cf:
        local_198 = (undefined1  [8])(local_158->_M_dataplus)._M_p;
        pcStack_190 = (char *)local_158->_M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x29;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)local_198;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_148,(v10 *)"cannot resolve the Registrar Hostname: {}",fmt,args);
        local_58 = kBadFormat;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,local_148._M_dataplus._M_p,
                   local_148._M_dataplus._M_p + local_148._M_string_length);
        __return_storage_ptr__->mCode = local_58;
        std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
      }
      else {
        MergeDataset(&this->mBbrDataset,(BbrDataset *)local_128);
        MergeDataset(&this->mBbrDataset,&local_c0);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.mRegistrarIpv6Addr._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.mRegistrarIpv6Addr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.mRegistrarHostname._M_dataplus._M_p != &local_c0.mRegistrarHostname.field_2) {
    operator_delete(local_c0.mRegistrarHostname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.mTriHostname._M_dataplus._M_p != &local_c0.mTriHostname.field_2) {
    operator_delete(local_c0.mTriHostname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p != &local_d8) {
    operator_delete(local_e8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p);
  }
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetRegistrarHostname(const std::string &aHostname)
{
    Error      error;
    BbrDataset bbrDataset;
    BbrDataset bbrDatasetWithRegAddr;

    bbrDataset.mRegistrarHostname = aHostname;
    bbrDataset.mPresentFlags |= BbrDataset::kRegistrarHostnameBit;

    SuccessOrExit(error = mCommissioner->SetBbrDataset(bbrDataset));
    SuccessOrExit(error = mCommissioner->GetBbrDataset(bbrDatasetWithRegAddr, BbrDataset::kRegistrarIpv6AddrBit));
    VerifyOrExit(bbrDatasetWithRegAddr.mPresentFlags & BbrDataset::kRegistrarIpv6AddrBit,
                 error = ERROR_BAD_FORMAT("cannot resolve the Registrar Hostname: {}", aHostname));

    MergeDataset(mBbrDataset, bbrDataset);
    MergeDataset(mBbrDataset, bbrDatasetWithRegAddr);

exit:
    return error;
}